

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Polyn(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGia;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *vOrder;
  char *pcVar5;
  uint fVeryVerbose;
  uint fVerbose;
  uint fSigned;
  char *pcVar6;
  uint local_50;
  char *local_40;
  
  local_40 = (char *)0x0;
  Extra_UtilGetoptReset();
  bVar2 = true;
  local_50 = 0;
  bVar1 = false;
  fSigned = 0;
  fVerbose = 0;
  fVeryVerbose = 0;
  do {
    while( true ) {
      while( true ) {
        while (iVar4 = Extra_UtilGetopt(argc,argv,"NSoasvwh"), iVar3 = globalUtilOptind,
              iVar4 == 0x77) {
          fVeryVerbose = fVeryVerbose ^ 1;
        }
        if (iVar4 < 0x61) break;
        if (iVar4 < 0x73) {
          if (iVar4 == 0x61) {
            bVar2 = (bool)(bVar2 ^ 1);
          }
          else {
            if (iVar4 != 0x6f) goto LAB_002916b5;
            bVar1 = (bool)(bVar1 ^ 1);
          }
        }
        else if (iVar4 == 0x73) {
          fSigned = fSigned ^ 1;
        }
        else {
          if (iVar4 != 0x76) goto LAB_002916b5;
          fVerbose = fVerbose ^ 1;
        }
      }
      if (iVar4 == -1) {
        pGia = pAbc->pGia;
        if (pGia == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9Esop(): There is no AIG.\n");
          return 0;
        }
        if (globalUtilOptind < argc) {
          printf("Trailing symbols on the command line (\"%s\").\n",argv[globalUtilOptind]);
          return 0;
        }
        if (!bVar1) {
          Gia_PolynBuild2Test(pGia,local_40,local_50,fSigned,fVerbose,fVeryVerbose);
          return 0;
        }
        if (bVar2) {
          Gia_PolynBuild(pGia,(Vec_Int_t *)0x0,fSigned,fVerbose,fVeryVerbose);
          return 0;
        }
        vOrder = Gia_PolynReorder(pGia,fVerbose,fVeryVerbose);
        Gia_PolynBuild(pAbc->pGia,vOrder,fSigned,fVerbose,fVeryVerbose);
        if (vOrder == (Vec_Int_t *)0x0) {
          return 0;
        }
        if (vOrder->pArray != (int *)0x0) {
          free(vOrder->pArray);
        }
        free(vOrder);
        return 0;
      }
      if (iVar4 != 0x4e) break;
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-N\" should be followed by an integer.\n";
        goto LAB_002916a9;
      }
      local_50 = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar3 + 1;
      if ((int)local_50 < 0) {
LAB_002916b5:
        Abc_Print(-2,"usage: &polyn [-N num] [-oasvwh] [-S str]\n");
        Abc_Print(-2,"\t         derives algebraic polynomial from AIG\n");
        Abc_Print(-2,
                  "\t-N num : the number of additional primary outputs (-1 = unused) [default = %d]\n"
                  ,(ulong)local_50);
        pcVar6 = "yes";
        pcVar5 = "yes";
        if (!bVar1) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-o     : toggles old computation [default = %s]\n",pcVar5);
        pcVar5 = "yes";
        if (!bVar2) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-a     : toggles simple computation [default = %s]\n",pcVar5);
        pcVar5 = "yes";
        if (fSigned == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-s     : toggles signed computation [default = %s]\n",pcVar5);
        pcVar5 = "yes";
        if (fVerbose == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-v     : toggles printing verbose information [default = %s]\n",pcVar5);
        if (fVeryVerbose == 0) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-w     : toggles printing very verbose information [default = %s]\n",pcVar6)
        ;
        Abc_Print(-2,"\t-h     : print the command usage\n");
        Abc_Print(-2,"\t\n");
        Abc_Print(-2,"\t-S str : (optional) the output signature as a character string\n");
        Abc_Print(-2,
                  "\t         The format used to represent the output signature is very restrictive.\n"
                 );
        Abc_Print(-2,
                  "\t         It should be a string without spaces containing monomials in terms of\n"
                 );
        Abc_Print(-2,
                  "\t         inputs (i<num>) and outputs (o<num>) where <num> is 0-based. Coefficients\n"
                 );
        Abc_Print(-2,
                  "\t         are degrees of two, represented by log2 of their value: for example, \n"
                 );
        Abc_Print(-2,"\t         \"2\" is 2^2 = 4, \"-4\" is -2^4=-16, \"-0\" is -2^0=-1, etc\n");
        Abc_Print(-2,"\t         Two types of signature are accepted:\n");
        Abc_Print(-2,
                  "\t         (1) a sequence of monomials without parentheses (for example, \"-2*o0+1*o1+0*o2\")\n"
                 );
        Abc_Print(-2,"\t         (2) a product of two sequences followed by a sum with a sequence\n"
                 );
        Abc_Print(-2,
                  "\t             (for example, \"(4*o0+2*o1+1*o2)*(4*i3+2*i4+1*i5)+(4*o3+2*o4+1*o5)\")\n"
                 );
        Abc_Print(-2,
                  "\t         Here is the signature of a signed 2-bit multiplier: \"(0*o0+1*o1+2*o2-3*o3)\"\n"
                 );
        return 1;
      }
    }
    if (iVar4 != 0x53) goto LAB_002916b5;
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-S\" should be followed by a char string without spaces.\n";
LAB_002916a9:
      Abc_Print(-1,pcVar5);
      goto LAB_002916b5;
    }
    local_40 = argv[globalUtilOptind];
    globalUtilOptind = globalUtilOptind + 1;
  } while( true );
}

Assistant:

int Abc_CommandAbc9Polyn( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_PolynBuild2Test( Gia_Man_t * pGia, char * pSign, int nExtra, int fSigned, int fVerbose, int fVeryVerbose );
    Vec_Int_t * vOrder = NULL; char * pSign = NULL;
    int c, nExtra = 0, fOld = 0, fSimple = 1, fSigned = 0, fVerbose = 0, fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NSoasvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nExtra = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nExtra < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a char string without spaces.\n" );
                goto usage;
            }
            pSign = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'o':
            fOld ^= 1;
            break;
        case 'a':
            fSimple ^= 1;
            break;
        case 's':
            fSigned ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Esop(): There is no AIG.\n" );
        return 0;
    }
    if ( argc >= globalUtilOptind + 1 )
    {
        printf( "Trailing symbols on the command line (\"%s\").\n", argv[globalUtilOptind] );
        return 0;
    }
    if ( fOld )
    {
        vOrder = fSimple ? NULL : Gia_PolynReorder( pAbc->pGia, fVerbose, fVeryVerbose );
        Gia_PolynBuild( pAbc->pGia, vOrder, fSigned, fVerbose, fVeryVerbose );
        Vec_IntFreeP( &vOrder );
    }
    else
        Gia_PolynBuild2Test( pAbc->pGia, pSign, nExtra, fSigned, fVerbose, fVeryVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &polyn [-N num] [-oasvwh] [-S str]\n" );
    Abc_Print( -2, "\t         derives algebraic polynomial from AIG\n" );
    Abc_Print( -2, "\t-N num : the number of additional primary outputs (-1 = unused) [default = %d]\n", nExtra );
    Abc_Print( -2, "\t-o     : toggles old computation [default = %s]\n",  fOld? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggles simple computation [default = %s]\n",  fSimple? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggles signed computation [default = %s]\n",  fSigned? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles printing verbose information [default = %s]\n",  fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggles printing very verbose information [default = %s]\n",  fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t\n");
    Abc_Print( -2, "\t-S str : (optional) the output signature as a character string\n" );
    Abc_Print( -2, "\t         The format used to represent the output signature is very restrictive.\n" );
    Abc_Print( -2, "\t         It should be a string without spaces containing monomials in terms of\n" );
    Abc_Print( -2, "\t         inputs (i<num>) and outputs (o<num>) where <num> is 0-based. Coefficients\n" );
    Abc_Print( -2, "\t         are degrees of two, represented by log2 of their value: for example, \n" );
    Abc_Print( -2, "\t         \"2\" is 2^2 = 4, \"-4\" is -2^4=-16, \"-0\" is -2^0=-1, etc\n" );
    Abc_Print( -2, "\t         Two types of signature are accepted:\n" );
    Abc_Print( -2, "\t         (1) a sequence of monomials without parentheses (for example, \"-2*o0+1*o1+0*o2\")\n" );
    Abc_Print( -2, "\t         (2) a product of two sequences followed by a sum with a sequence\n" );
    Abc_Print( -2, "\t             (for example, \"(4*o0+2*o1+1*o2)*(4*i3+2*i4+1*i5)+(4*o3+2*o4+1*o5)\")\n" );
    Abc_Print( -2, "\t         Here is the signature of a signed 2-bit multiplier: \"(0*o0+1*o1+2*o2-3*o3)\"\n" );
    return 1;
}